

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

bool __thiscall
Minisat::OnlineProofChecker::addClause
          (OnlineProofChecker *this,vec<Minisat::Lit> *cls,bool checkOnly)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Lit p;
  int iVar5;
  Lit *pLVar6;
  ostream *poVar7;
  size_type sVar8;
  vec<Minisat::Lit> *this_00;
  byte in_DL;
  vec<Minisat::Lit> *in_RSI;
  byte *in_RDI;
  int i_4;
  CRef ref;
  int k;
  int j;
  Clause *d;
  size_t i_3;
  bool resovleConflict;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *list;
  Lit resolveLit;
  int initialSize;
  int i_2;
  int i_1;
  int i;
  int initialVars;
  bool conflict;
  undefined4 in_stack_fffffffffffffe68;
  uint32_t in_stack_fffffffffffffe6c;
  vec<Minisat::Lit> *in_stack_fffffffffffffe70;
  vec<Minisat::Lit> *in_stack_fffffffffffffe78;
  Lit in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  ostream *in_stack_fffffffffffffe90;
  OnlineProofChecker *in_stack_fffffffffffffea0;
  ostream *in_stack_fffffffffffffec8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffed0;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_e8;
  lbool local_dd;
  int local_dc;
  int local_d8;
  lbool local_d1;
  int local_d0;
  int local_cc;
  lbool local_c5;
  int local_c4;
  lbool local_bd;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  Lit local_a0;
  int local_9c;
  Clause *local_98;
  ulong local_90;
  byte local_81;
  int local_80;
  int local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  Lit local_6c;
  undefined4 in_stack_ffffffffffffff98;
  Lit in_stack_ffffffffffffff9c;
  int local_58;
  lbool local_4d;
  int local_4c;
  int local_48;
  lbool local_41;
  int local_40;
  int local_3c;
  lbool local_35;
  int local_34;
  lbool local_2d;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  byte local_1a;
  byte local_19;
  vec<Minisat::Lit> *local_18;
  
  local_19 = in_DL & 1;
  if ((*in_RDI & 1) == 0) {
    return true;
  }
  local_1a = 0;
  local_18 = in_RSI;
  local_20 = nVars((OnlineProofChecker *)0x115ae9);
  for (local_24 = 0; iVar4 = local_24, iVar3 = vec<Minisat::Lit>::size(local_18), iVar4 < iVar3;
      local_24 = local_24 + 1) {
    while( true ) {
      iVar4 = nVars((OnlineProofChecker *)0x115b32);
      pLVar6 = vec<Minisat::Lit>::operator[](local_18,local_24);
      local_28 = pLVar6->x;
      iVar3 = var((Lit)local_28);
      if (iVar3 < iVar4) break;
      newVar((OnlineProofChecker *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
  }
  if (3 < *(int *)(in_RDI + 0xf8)) {
    std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] add/check clause ");
    poVar7 = operator<<((ostream *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x),
                        in_stack_fffffffffffffe78);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    printState(in_stack_fffffffffffffea0);
  }
  cancelUntil((OnlineProofChecker *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x))
  ;
  for (local_2c = 0; iVar4 = local_2c, iVar3 = vec<Minisat::Lit>::size(local_18), iVar4 < iVar3;
      local_2c = local_2c + 1) {
    pLVar6 = vec<Minisat::Lit>::operator[](local_18,local_2c);
    local_34 = pLVar6->x;
    local_2d = value((OnlineProofChecker *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe80);
    lbool::lbool(&local_35,'\x02');
    bVar2 = lbool::operator==(&local_2d,local_35);
    if (bVar2) {
      pLVar6 = vec<Minisat::Lit>::operator[](local_18,local_2c);
      local_40 = pLVar6->x;
      local_3c = (int)operator~((Lit)local_40);
      uncheckedEnqueue((OnlineProofChecker *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (Lit)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    }
    else {
      pLVar6 = vec<Minisat::Lit>::operator[](local_18,local_2c);
      local_4c = pLVar6->x;
      local_48 = (int)operator~((Lit)local_4c);
      local_41 = value((OnlineProofChecker *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe80);
      lbool::lbool(&local_4d,'\x01');
      bVar2 = lbool::operator==(&local_41,local_4d);
      if (bVar2) {
        local_1a = 1;
        break;
      }
    }
  }
  if ((local_1a & 1) == 0) {
    if (3 < *(int *)(in_RDI + 0xf8)) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "c [DRAT-OTFC] clause does not conflict by pure enquing ");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    bVar2 = propagate((OnlineProofChecker *)
                      CONCAT44(in_stack_ffffffffffffff9c.x,in_stack_ffffffffffffff98));
    if (bVar2) {
      local_1a = 1;
      if (3 < *(int *)(in_RDI + 0xf8)) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] clause is DRUP ");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      if (3 < *(int *)(in_RDI + 0xf8)) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] clause is not DRUP ");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      if (*(int *)(in_RDI + 4) != 2) {
        if (1 < *(int *)(in_RDI + 0xf8)) {
          std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ");
          poVar7 = operator<<((ostream *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x),
                              in_stack_fffffffffffffe78);
          poVar7 = std::operator<<(poVar7," is not a DRUP clause, and we do not check DRAT");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        printState(in_stack_fffffffffffffea0);
        return false;
      }
      iVar3 = vec<Minisat::Lit>::size(local_18);
      iVar4 = local_20;
      if ((iVar3 == 0) && ((local_19 & 1) != 0)) {
        return false;
      }
      pLVar6 = vec<Minisat::Lit>::operator[](local_18,0);
      iVar3 = var((Lit)pLVar6->x);
      if (iVar4 < iVar3) {
        local_1a = 1;
      }
      else {
        MarkArray::nextStep((MarkArray *)in_stack_fffffffffffffe70);
        vec<Minisat::Lit>::clear
                  (in_stack_fffffffffffffe70,SUB41(in_stack_fffffffffffffe6c >> 0x18,0));
        for (local_58 = 1; iVar4 = vec<Minisat::Lit>::size(local_18), local_58 < iVar4;
            local_58 = local_58 + 1) {
          pLVar6 = vec<Minisat::Lit>::operator[](local_18,local_58);
          p = operator~(pLVar6->x);
          toInt(p);
          bVar2 = MarkArray::isCurrentStep
                            ((MarkArray *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
          if (bVar2) {
            local_1a = 1;
            break;
          }
          pLVar6 = vec<Minisat::Lit>::operator[](local_18,local_58);
          in_stack_ffffffffffffff9c.x = pLVar6->x;
          toInt(in_stack_ffffffffffffff9c);
          MarkArray::setCurrentStep
                    ((MarkArray *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
          vec<Minisat::Lit>::operator[](local_18,local_58);
          vec<Minisat::Lit>::push
                    (in_stack_fffffffffffffe70,
                     (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        }
        if ((local_1a & 1) == 0) {
          iVar4 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 200));
          pLVar6 = vec<Minisat::Lit>::operator[](local_18,0);
          local_6c.x = pLVar6->x;
          if (3 < *(int *)(in_RDI + 0xf8)) {
            std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] use literal ");
            poVar7 = operator<<(in_stack_fffffffffffffe90,
                                (Lit *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                               );
            poVar7 = std::operator<<(poVar7," for DRAT check");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          local_1a = 1;
          in_stack_fffffffffffffed0 =
               (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)(in_RDI + 0x40);
          local_80 = local_6c.x;
          local_7c = (int)operator~(local_6c);
          iVar3 = toInt((Lit)local_7c);
          local_78 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[](in_stack_fffffffffffffed0,(long)iVar3);
          local_81 = 0;
          if (4 < *(int *)(in_RDI + 0xf8)) {
            in_stack_fffffffffffffec8 =
                 std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] resolve against ");
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_78);
            poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffec8,sVar8);
            poVar7 = std::operator<<(poVar7," clauses");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
          for (local_90 = 0; uVar1 = local_90,
              sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_78),
              uVar1 < sVar8; local_90 = local_90 + 1) {
            iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 200));
            vec<Minisat::Lit>::shrink_((vec<Minisat::Lit> *)(in_RDI + 200),iVar3 - iVar4);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_78,local_90);
            local_98 = ClauseAllocator::operator[]
                                 ((ClauseAllocator *)in_stack_fffffffffffffe70,
                                  in_stack_fffffffffffffe6c);
            if (4 < *(int *)(in_RDI + 0xf8)) {
              std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] resolve with clause ");
              poVar7 = operator<<((ostream *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x),
                                  (Clause *)in_stack_fffffffffffffe78);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            for (local_9c = 0; iVar3 = local_9c, iVar5 = Clause::size(local_98), iVar3 < iVar5;
                local_9c = local_9c + 1) {
              local_a0 = Clause::operator[](local_98,local_9c);
              local_a8 = local_6c.x;
              local_a4 = (int)operator~(local_6c);
              bVar2 = Lit::operator==(&local_a0,(Lit)local_a4);
              if (!bVar2) {
                in_stack_fffffffffffffea0 = (OnlineProofChecker *)(in_RDI + 0x90);
                local_b0 = (int)Clause::operator[](local_98,local_9c);
                local_ac = (int)operator~((Lit)local_b0);
                toInt((Lit)local_ac);
                bVar2 = MarkArray::isCurrentStep
                                  ((MarkArray *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c)
                ;
                if (bVar2) break;
                local_b4 = (int)Clause::operator[](local_98,local_9c);
                toInt((Lit)local_b4);
                bVar2 = MarkArray::isCurrentStep
                                  ((MarkArray *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c)
                ;
                if (((bVar2 ^ 0xffU) & 1) != 0) {
                  in_stack_fffffffffffffe90 = (ostream *)(in_RDI + 200);
                  local_b8 = (int)Clause::operator[](local_98,local_9c);
                  vec<Minisat::Lit>::push
                            (in_stack_fffffffffffffe70,
                             (Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
                }
              }
            }
            in_stack_fffffffffffffe8c = local_9c;
            iVar3 = Clause::size(local_98);
            if (in_stack_fffffffffffffe8c == iVar3) {
              if (3 < *(int *)(in_RDI + 0xf8)) {
                std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] test resolvent ");
                poVar7 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x),
                                    in_stack_fffffffffffffe78);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              local_81 = 0;
              cancelUntil((OnlineProofChecker *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x));
              local_bc = 0;
              while (in_stack_fffffffffffffe88 = local_bc,
                    iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 200)),
                    in_stack_fffffffffffffe88 < iVar3) {
                pLVar6 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 200),local_bc)
                ;
                local_c4 = pLVar6->x;
                local_bd = value((OnlineProofChecker *)in_stack_fffffffffffffe78,
                                 in_stack_fffffffffffffe80);
                lbool::lbool(&local_c5,'\x02');
                bVar2 = lbool::operator==(&local_bd,local_c5);
                if (bVar2) {
                  pLVar6 = vec<Minisat::Lit>::operator[]
                                     ((vec<Minisat::Lit> *)(in_RDI + 200),local_bc);
                  local_d0 = pLVar6->x;
                  local_cc = (int)operator~((Lit)local_d0);
                  uncheckedEnqueue((OnlineProofChecker *)
                                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                   (Lit)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
                }
                else {
                  pLVar6 = vec<Minisat::Lit>::operator[]
                                     ((vec<Minisat::Lit> *)(in_RDI + 200),local_bc);
                  local_dc = pLVar6->x;
                  local_d8 = (int)operator~((Lit)local_dc);
                  local_d1 = value((OnlineProofChecker *)in_stack_fffffffffffffe78,
                                   in_stack_fffffffffffffe80);
                  lbool::lbool(&local_dd,'\x01');
                  bVar2 = lbool::operator==(&local_d1,local_dd);
                  if (bVar2) {
                    local_81 = 1;
                    if (4 < *(int *)(in_RDI + 0xf8)) {
                      std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ");
                      poVar7 = operator<<((ostream *)
                                          CONCAT44(in_stack_fffffffffffffe84,
                                                   in_stack_fffffffffffffe80.x),
                                          in_stack_fffffffffffffe78);
                      poVar7 = std::operator<<(poVar7," conflicts during enqueing its literals");
                      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                    }
                    break;
                  }
                }
                local_bc = local_bc + 1;
              }
              if (((local_81 & 1) == 0) &&
                 (bVar2 = propagate((OnlineProofChecker *)
                                    CONCAT44(in_stack_ffffffffffffff9c.x,iVar4)), !bVar2)) {
                local_1a = 0;
                if (1 < *(int *)(in_RDI + 0xf8)) {
                  std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ");
                  poVar7 = operator<<((ostream *)
                                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x
                                              ),in_stack_fffffffffffffe78);
                  std::operator<<(poVar7," is not a DRAT clause -- resolution on ");
                  poVar7 = operator<<(in_stack_fffffffffffffe90,
                                      (Lit *)CONCAT44(in_stack_fffffffffffffe8c,
                                                      in_stack_fffffffffffffe88));
                  std::operator<<(poVar7," with ");
                  poVar7 = operator<<((ostream *)
                                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x
                                              ),(Clause *)in_stack_fffffffffffffe78);
                  poVar7 = std::operator<<(poVar7," failed! (does not result in a conflict with UP)"
                                          );
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                }
                printState(in_stack_fffffffffffffea0);
                return false;
              }
              if (6 < *(int *)(in_RDI + 0xf8)) {
                std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ");
                poVar7 = operator<<((ostream *)
                                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x),
                                    in_stack_fffffffffffffe78);
                poVar7 = std::operator<<(poVar7," conflicts during enqueing/propagating");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
            }
            else if (4 < *(int *)(in_RDI + 0xf8)) {
              poVar7 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] resolvent is tautology")
              ;
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
          }
          if ((local_1a & 1) == 0) {
            return false;
          }
        }
      }
    }
  }
  if ((local_19 & 1) == 0) {
    iVar4 = vec<Minisat::Lit>::size(local_18);
    if (iVar4 == 0) {
      *in_RDI = 0;
    }
    else {
      iVar4 = vec<Minisat::Lit>::size(local_18);
      if (iVar4 < 2) {
        this_00 = (vec<Minisat::Lit> *)(in_RDI + 0x30);
        vec<Minisat::Lit>::operator[](local_18,0);
        vec<Minisat::Lit>::push
                  (this_00,(Lit *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
      else {
        ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                  ((ClauseAllocator *)in_stack_fffffffffffffe90,
                   (vec<Minisat::Lit> *)
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0));
        local_e8 = 0;
        while (in_stack_fffffffffffffe84 = local_e8, iVar4 = vec<Minisat::Lit>::size(local_18),
              in_stack_fffffffffffffe84 < iVar4) {
          in_stack_fffffffffffffe78 = (vec<Minisat::Lit> *)(in_RDI + 0x40);
          pLVar6 = vec<Minisat::Lit>::operator[](local_18,local_e8);
          iVar4 = toInt((Lit)pLVar6->x);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)in_stack_fffffffffffffe78,(long)iVar4);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x),
                     (value_type_conflict1 *)in_stack_fffffffffffffe78);
          local_e8 = local_e8 + 1;
        }
        attachClause((OnlineProofChecker *)in_stack_fffffffffffffed0,
                     (CRef)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        vec<unsigned_int>::push
                  ((vec<unsigned_int> *)in_stack_fffffffffffffe70,
                   (uint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
      if (1 < *(int *)(in_RDI + 0xf8)) {
        std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] added the clause ");
        poVar7 = operator<<((ostream *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80.x),
                            in_stack_fffffffffffffe78);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return true;
}

Assistant:

inline bool OnlineProofChecker::addClause(const vec<Lit> &cls, bool checkOnly)
{
    if (!ok) {
        return true;
    } // trivially true, we reached the empty clause already!
    bool conflict = false;

    const int initialVars = nVars();

    // have enough variables present
    for (int i = 0; i < cls.size(); ++i) {
        while (nVars() <= var(cls[i])) {
            newVar();
        }
    }

    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] add/check clause " << cls << std::endl;
        printState();
    }

    // enqueue all complementary literals!
    cancelUntil();
    for (int i = 0; i < cls.size(); ++i) {
        if (value(cls[i]) == l_Undef) {
            uncheckedEnqueue(~cls[i]);
        } else if (value(~cls[i]) == l_False) {
            conflict = true;
            break;
        }
    }

    if (!conflict) {
        DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause does not conflict by pure enquing " << std::endl;);
        if (propagate()) {
            conflict = true; // DRUP!
            DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause is DRUP " << std::endl;);
        } else {
            DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause is not DRUP " << std::endl;);
            if (proof == dratProof) { // are we checking DRAT?
                if (cls.size() == 0 && checkOnly) {
                    return false;
                }
                assert(cls.size() > 0 && "checking the empty clause cannot reach here (it can only be a RUP clause, "
                                         "not a RAT clause -- empty clause is not entailed");
                if (initialVars >= var(cls[0])) { // DRAT on the first variable, because this variable is not present before!
                    // build all resolents on the first literal!
                    ma.nextStep();
                    lits.clear();
                    for (int i = 1; i < cls.size(); ++i) {
                        if (ma.isCurrentStep(toInt(~cls[i]))) {
                            conflict = true;
                            break;
                        }                                 // clause has complementary literals, accept it!
                        ma.setCurrentStep(toInt(cls[i])); // mark all except the first literal!
                        lits.push(cls[i]);
                    }
                    if (!conflict) {
                        const int initialSize =
                        lits.size(); // these literals are added by resolving with  the current clause on its first literal
                        assert(initialSize + 1 == cls.size() &&
                               "initial resolvent size has all literals except the literal to resolve on");
                        const Lit resolveLit = cls[0];
                        if (verbose > 3) {
                            std::cerr << "c [DRAT-OTFC] use literal " << resolveLit << " for DRAT check" << std::endl;
                        }
                        conflict = true;
                        const std::vector<CRef> &list = occ[toInt(~resolveLit)];
                        bool resovleConflict = false;
                        if (verbose > 4) {
                            std::cerr << "c [DRAT-OTFC] resolve against " << list.size() << " clauses" << std::endl;
                        }
                        for (size_t i = 0; i < list.size(); ++i) {
                            // build resolvent
                            lits.shrink_(lits.size() - initialSize); // remove literals from previous addClause call
                            const Clause &d = ca[list[i]];
                            if (verbose > 4) {
                                std::cerr << "c [DRAT-OTFC] resolve with clause " << d << std::endl;
                            }
                            int j = 0;
                            for (; j < d.size(); ++j) {
                                if (d[j] == ~resolveLit) {
                                    continue;
                                } // this literal is used for resolution
                                if (ma.isCurrentStep(toInt(~d[j]))) {
                                    break;
                                } // resolvent is a tautology
                                if (!ma.isCurrentStep(toInt(d[j]))) {
                                    // ma.setCurrentStep( toInt(d[j]) );  // do not do this, because there are multiple
                                    // resolvents! // this step might be redundant -- however, here we can ensure that also clauses with duplicate literals can be handled, as well as tautologic clauses!
                                    lits.push(d[j]);
                                }
                            }
                            if (j != d.size()) {
                                if (verbose > 4) {
                                    std::cerr << "c [DRAT-OTFC] resolvent is tautology" << std::endl;
                                }
                                continue; // this resolvent would be tautological!
                            }
                            // lits contains all literals of the resolvent, propagate and check for the conflict!

                            if (verbose > 3) {
                                std::cerr << "c [DRAT-OTFC] test resolvent " << lits << std::endl;
                            }
                            // enqueue all complementary literals!
                            resovleConflict = false;
                            cancelUntil();
                            for (int k = 0; k < lits.size(); ++k) {
                                if (value(lits[k]) == l_Undef) {
                                    uncheckedEnqueue(~lits[k]);
                                } else if (value(~lits[k]) == l_False) {
                                    resovleConflict = true;
                                    DOUT(if (verbose > 4) std::cerr << "c [DRAT-OTFC] the clause " << cls
                                                                    << " conflicts during enqueing its literals" << std::endl;);
                                    break;
                                } // the clause itself is tautological ...
                            }
                            if (!resovleConflict && !propagate()) {
                                conflict = false; // not DRAT, the current resolvent does not lead to a conflict!
                                if (verbose > 1) {
                                    std::cerr << "c [DRAT-OTFC] the clause " << cls
                                              << " is not a DRAT clause -- resolution on " << resolveLit << " with "
                                              << d << " failed! (does not result in a conflict with UP)" << std::endl;
                                }
                                printState();
                                assert(false && "added clause has to be a DRAT clause");
                                return false;
                            } else {
                                DOUT(if (verbose > 6) std::cerr << "c [DRAT-OTFC] the clause " << cls
                                                                << " conflicts during enqueing/propagating" << std::endl;);
                            }
                        }
                        assert(conflict && "added clause has to be a DRAT clause");
                        if (!conflict) {
                            return false;
                        }
                    } // else conflict == true
                } else {
                    conflict = true;
                } // DRAT, because we have a fresh variable!
            } else {
                if (verbose > 1) {
                    std::cerr << "c [DRAT-OTFC] the clause " << cls << " is not a DRUP clause, and we do not check DRAT"
                              << std::endl;
                }
                printState();
                assert(false && "added clause has to be a DRUP clause");
                return false;
            }
        }
    }

    // do not actually add the clause
    if (checkOnly) {
        return true;
    }

    // add the clause ...
    if (cls.size() == 0) {
        ok = false;
        return true;
    }

    if (cls.size() > 1) {
        CRef ref = ca.alloc(cls, false);
        for (int i = 0; i < cls.size(); ++i) {
            occ[toInt(cls[i])].push_back(ref);
        }
        attachClause(ref);
        clauses.push(ref);
    } else {
        unitClauses.push(cls[0]);
    }
    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] added the clause " << cls << std::endl;
    }
    return true;
}